

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::UnknownFieldSet::AddLengthDelimited_abi_cxx11_(UnknownFieldSet *this,int number)

{
  string *this_00;
  undefined1 local_28 [8];
  UnknownField field;
  int number_local;
  UnknownFieldSet *this_local;
  
  local_28._0_4_ = number;
  field.data_.varint_._4_4_ = number;
  UnknownField::SetType((UnknownField *)local_28,TYPE_LENGTH_DELIMITED);
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string(this_00);
  field._0_8_ = this_00;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(&this->fields_,(value_type *)local_28);
  return (string *)field._0_8_;
}

Assistant:

std::string* UnknownFieldSet::AddLengthDelimited(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_LENGTH_DELIMITED);
  field.data_.length_delimited_.string_value = new std::string;
  fields_.push_back(field);
  return field.data_.length_delimited_.string_value;
}